

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

void __thiscall xemmai::t_script::f_scan(t_script *this,t_scan a_scan)

{
  lock_guard<std::mutex> lVar1;
  bool bVar2;
  reference this_00;
  t_object *ptVar3;
  t_slot *p;
  iterator __end1;
  iterator __begin1;
  deque<xemmai::t_slot,_std::allocator<xemmai::t_slot>_> *__range1;
  lock_guard<std::mutex> lock;
  t_scan a_scan_local;
  t_script *this_local;
  
  lock._M_device = (mutex_type *)a_scan;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->v_mutex);
  std::deque<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>::begin
            ((iterator *)&__end1._M_node,&this->v_slots);
  std::deque<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>::end((iterator *)&p,&this->v_slots);
  while( true ) {
    bVar2 = std::operator==((_Self *)&__end1._M_node,(_Self *)&p);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = std::_Deque_iterator<xemmai::t_slot,_xemmai::t_slot_&,_xemmai::t_slot_*>::operator*
                        ((_Deque_iterator<xemmai::t_slot,_xemmai::t_slot_&,_xemmai::t_slot_*> *)
                         &__end1._M_node);
    lVar1 = lock;
    ptVar3 = t_slot::operator_cast_to_t_object_(this_00);
    (*(code *)lVar1._M_device)(ptVar3);
    std::_Deque_iterator<xemmai::t_slot,_xemmai::t_slot_&,_xemmai::t_slot_*>::operator++
              ((_Deque_iterator<xemmai::t_slot,_xemmai::t_slot_&,_xemmai::t_slot_*> *)
               &__end1._M_node);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void t_script::f_scan(t_scan a_scan)
{
	std::lock_guard lock(v_mutex);
	for (auto& p : v_slots) a_scan(p);
}